

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O2

void __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
::Resize(WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
         *this)

{
  code *pcVar1;
  bool bVar2;
  uint prime;
  hash_t hVar3;
  Recycler *pRVar4;
  int *ptr;
  ulong uVar5;
  WeakRefDictionaryEntry<Js::EntryPointInfo,_unsigned_char> *dst;
  undefined4 *puVar6;
  ulong uVar7;
  long lVar8;
  size_t count;
  int *piVar9;
  undefined1 local_70 [8];
  TrackAllocData data;
  int local_34 [2];
  int modIndex;
  
  local_34[0] = 0x4b;
  prime = PrimePolicy::GetPrime(this->count * 2,local_34);
  if ((int)prime <= this->count) {
    Js::Throw::OutOfMemory();
  }
  count = (size_t)(int)prime;
  local_70 = (undefined1  [8])&int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_18a073;
  data.filename._0_4_ = 0x165;
  data.plusSize = count;
  pRVar4 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_70);
  uVar7 = 0;
  ptr = Memory::AllocateArray<Memory::Recycler,int,false>
                  ((Memory *)pRVar4,(Recycler *)Memory::Recycler::AllocLeaf,0,count);
  uVar5 = 0;
  if (0 < (int)prime) {
    uVar5 = (ulong)prime;
  }
  for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    ptr[uVar7] = -1;
  }
  local_70 = (undefined1  [8])&WeakRefDictionaryEntry<Js::EntryPointInfo,unsigned_char>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_18a073;
  data.filename._0_4_ = 0x167;
  data.plusSize = count;
  pRVar4 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_70);
  dst = Memory::
        AllocateArray<Memory::Recycler,JsUtil::WeakRefDictionaryEntry<Js::EntryPointInfo,unsigned_char>,false>
                  ((Memory *)pRVar4,(Recycler *)Memory::Recycler::Alloc,0,count);
  data._32_8_ = &this->entries;
  Memory::
  CopyArray<JsUtil::WeakRefDictionaryEntry<Js::EntryPointInfo,unsigned_char>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::EntryPointInfo>const>,Memory::Recycler>
            (dst,count,
             (WriteBarrierPtr<JsUtil::WeakRefDictionaryEntry<Js::EntryPointInfo,_unsigned_char>_> *)
             data._32_8_,(long)this->count);
  if ((int)prime <= this->count) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/Dictionary.h"
                       ,0x169,"(count < newSize)","count < newSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  this->modFunctionIndex = local_34[0];
  piVar9 = &dst->next;
  for (lVar8 = 0; lVar8 < this->count; lVar8 = lVar8 + 1) {
    hVar3 = PrimePolicy::ModPrime
                      (((WeakRefDictionaryEntry<Js::EntryPointInfo,_unsigned_char> *)(piVar9 + -1))
                       ->hash,prime,this->modFunctionIndex);
    *piVar9 = ptr[hVar3];
    ptr[hVar3] = (int)lVar8;
    piVar9 = piVar9 + 6;
  }
  Memory::WriteBarrierPtr<int>::WriteBarrierSet(&this->buckets,ptr);
  this->size = prime;
  Memory::WriteBarrierPtr<JsUtil::WeakRefDictionaryEntry<Js::EntryPointInfo,_unsigned_char>_>::
  WriteBarrierSet((WriteBarrierPtr<JsUtil::WeakRefDictionaryEntry<Js::EntryPointInfo,_unsigned_char>_>
                   *)data._32_8_,dst);
  return;
}

Assistant:

void Resize()
        {
            int modIndex = UNKNOWN_MOD_INDEX;
            int newSize = PrimePolicy::GetSize(count * 2, &modIndex);

            if (newSize <= count)
            {
                // throw OOM if we can't increase the dictionary size
                Js::Throw::OutOfMemory();
            }

            int* newBuckets = RecyclerNewArrayLeaf(recycler, int, newSize);
            for (int i = 0; i < newSize; i++) newBuckets[i] = -1;
            EntryType* newEntries = RecyclerNewArray(recycler, EntryType, newSize);
            CopyArray<EntryType, Field(const RecyclerWeakReference<TKey>*)>(newEntries, newSize, entries, count);
            AnalysisAssert(count < newSize);
            modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                uint bucket = PrimePolicy::GetBucket(newEntries[i].hash, newSize, modFunctionIndex);
                newEntries[i].next = newBuckets[bucket];
                newBuckets[bucket] = i;
            }
            buckets = newBuckets;
            size = newSize;
            entries = newEntries;
        }